

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_UShort * ft_var_readpackedpoints(FT_Stream stream,FT_ULong size,FT_UInt *point_cnt)

{
  FT_Memory memory;
  byte bVar1;
  byte bVar2;
  FT_UInt16 FVar3;
  uint uVar4;
  ulong in_RAX;
  FT_UShort *pFVar5;
  FT_UShort FVar6;
  uint uVar7;
  uint uVar8;
  FT_UShort *pFVar10;
  bool bVar11;
  ulong local_38;
  FT_Error error;
  FT_UShort *pFVar9;
  
  memory = stream->memory;
  *point_cnt = 0;
  local_38 = in_RAX;
  bVar1 = FT_Stream_GetByte(stream);
  if (bVar1 == 0) {
    pFVar10 = (FT_UShort *)0xffffffffffffffff;
  }
  else {
    uVar4 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      bVar2 = FT_Stream_GetByte(stream);
      uVar4 = (uint)bVar2 | (bVar1 & 0x7f) << 8;
    }
    if (size < uVar4) {
      pFVar10 = (FT_UShort *)0x0;
    }
    else {
      pFVar5 = (FT_UShort *)ft_mem_qrealloc(memory,2,0,(ulong)(uVar4 + 1),(void *)0x0,&error);
      pFVar10 = (FT_UShort *)0x0;
      if (error == 0) {
        *point_cnt = uVar4;
        FVar6 = 0;
        pFVar9 = (FT_UShort *)0x0;
LAB_002177f0:
        pFVar10 = pFVar5;
        if ((uint)pFVar9 < uVar4) {
          bVar1 = FT_Stream_GetByte(stream);
          uVar7 = (uint)bVar1;
          local_38 = CONCAT44(error,(uint)pFVar9 + 1);
          if ((char)bVar1 < '\0') {
            uVar7 = uVar7 & 0x7f;
            FVar3 = FT_Stream_GetUShort(stream);
            FVar6 = FVar6 + FVar3;
            pFVar5[(long)pFVar9] = FVar6;
            pFVar10 = (FT_UShort *)(local_38 & 0xffffffff);
            do {
              bVar11 = uVar7 == 0;
              uVar7 = uVar7 - 1;
              pFVar9 = pFVar10;
              if (bVar11) break;
              FVar3 = FT_Stream_GetUShort(stream);
              FVar6 = FVar6 + FVar3;
              uVar8 = (int)pFVar10 + 1;
              pFVar9 = (FT_UShort *)(ulong)uVar8;
              pFVar5[(long)pFVar10] = FVar6;
              pFVar10 = pFVar9;
            } while (uVar8 < uVar4);
          }
          else {
            bVar1 = FT_Stream_GetByte(stream);
            FVar6 = FVar6 + bVar1;
            pFVar5[(long)pFVar9] = FVar6;
            pFVar10 = (FT_UShort *)(local_38 & 0xffffffff);
            do {
              bVar11 = uVar7 == 0;
              uVar7 = uVar7 - 1;
              pFVar9 = pFVar10;
              if (bVar11) break;
              bVar1 = FT_Stream_GetByte(stream);
              FVar6 = FVar6 + bVar1;
              uVar8 = (int)pFVar10 + 1;
              pFVar9 = (FT_UShort *)(ulong)uVar8;
              pFVar5[(long)pFVar10] = FVar6;
              pFVar10 = pFVar9;
            } while (uVar8 < uVar4);
          }
          goto LAB_002177f0;
        }
      }
    }
  }
  return pFVar10;
}

Assistant:

static FT_UShort*
  ft_var_readpackedpoints( FT_Stream  stream,
                           FT_ULong   size,
                           FT_UInt   *point_cnt )
  {
    FT_UShort *points = NULL;
    FT_UInt    n;
    FT_UInt    runcnt;
    FT_UInt    i, j;
    FT_UShort  first;
    FT_Memory  memory = stream->memory;
    FT_Error   error;


    *point_cnt = 0;

    n = FT_GET_BYTE();
    if ( n == 0 )
      return ALL_POINTS;

    if ( n & GX_PT_POINTS_ARE_WORDS )
    {
      n  &= GX_PT_POINT_RUN_COUNT_MASK;
      n <<= 8;
      n  |= FT_GET_BYTE();
    }

    if ( n > size )
    {
      FT_TRACE1(( "ft_var_readpackedpoints: number of points too large\n" ));
      return NULL;
    }

    /* in the nested loops below we increase `i' twice; */
    /* it is faster to simply allocate one more slot    */
    /* than to add another test within the loop         */
    if ( FT_QNEW_ARRAY( points, n + 1 ) )
      return NULL;

    *point_cnt = n;

    first = 0;
    i     = 0;
    while ( i < n )
    {
      runcnt = FT_GET_BYTE();
      if ( runcnt & GX_PT_POINTS_ARE_WORDS )
      {
        runcnt     &= GX_PT_POINT_RUN_COUNT_MASK;
        first      += FT_GET_USHORT();
        points[i++] = first;

        /* first point not included in run count */
        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_USHORT();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
      else
      {
        first      += FT_GET_BYTE();
        points[i++] = first;

        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_BYTE();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
    }

    return points;
  }